

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::ISOYearOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  char cVar1;
  date_t input_00;
  date_t input_01;
  reference stats;
  LogicalType aLStack_118 [24];
  BaseStatistics result;
  Value min_value;
  Value max_value;
  
  this_00 = *(vector<duckdb::BaseStatistics,_true> **)(input + 0x10);
  stats = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,1);
  cVar1 = duckdb::NumericStats::HasMinMax(stats);
  if (cVar1 != '\0') {
    input_00 = NumericStats::GetMin<duckdb::date_t>(stats);
    input_01 = NumericStats::GetMax<duckdb::date_t>(stats);
    if (input_00.days <= input_01.days) {
      DateTrunc::
      UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::ISOYearOperator>(input_00)
      ;
      DateTrunc::
      UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::ISOYearOperator>(input_01)
      ;
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)&min_value);
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)&max_value);
      duckdb::LogicalType::LogicalType(aLStack_118,(LogicalType *)&min_value);
      duckdb::NumericStats::CreateEmpty(&result,aLStack_118);
      duckdb::LogicalType::~LogicalType(aLStack_118);
      duckdb::NumericStats::SetMin(&result,&min_value);
      duckdb::NumericStats::SetMax(&result,&max_value);
      vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
      duckdb::BaseStatistics::CopyValidity(&result);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(&result);
      duckdb::Value::~Value(&max_value);
      duckdb::Value::~Value(&min_value);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}